

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O1

bool __thiscall
pbrt::ParseArg<pstd::span<float>>
          (pbrt *this,char ***argv,string *name,span<float> out,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *onError)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  bool bVar6;
  span<float> out_00;
  span<float> out_01;
  string value;
  string arg;
  __string_type __str;
  string ret;
  string local_100;
  string local_e0;
  size_t local_c0;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_c0 = out.n;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,(char *)**(undefined8 **)this,(allocator<char> *)&local_100);
  if (local_e0._M_dataplus._M_p[1] == '-') {
    std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_e0);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_e0);
  }
  std::__cxx11::string::operator=((string *)&local_e0,(string *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  anon_unknown_4::normalizeArg(&local_100,&local_e0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,*argv,(long)argv[1] + (long)*argv);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_90._M_string_length,0,'\x01');
  anon_unknown_4::normalizeArg(&local_b0,&local_90);
  if (local_100._M_string_length < local_b0._M_string_length) {
LAB_00208172:
    bVar6 = false;
  }
  else {
    bVar6 = local_b0._M_string_length == 0;
    if (!bVar6) {
      if (*local_b0._M_dataplus._M_p != *local_100._M_dataplus._M_p) goto LAB_00208172;
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        if (local_b0._M_string_length == uVar5) break;
        uVar2 = uVar5 + 1;
      } while (local_b0._M_dataplus._M_p[uVar5] == local_100._M_dataplus._M_p[uVar5]);
      bVar6 = local_b0._M_string_length <= uVar5;
    }
  }
  local_b8 = name;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_100.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != paVar1) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    *(long *)this = *(long *)this + 8;
    sVar4 = 0xffffffffffffffff;
    std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_e0);
    out_00.n = sVar4;
    out_00.ptr = out.ptr;
    bVar6 = anon_unknown_4::initArg((anon_unknown_4 *)&local_100,local_b8,out_00);
    if (!bVar6) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string_const&>
                (&local_50,"invalid value \"%s\" for %s argument",&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)argv);
      if (*(long *)(local_c0 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(local_c0 + 0x18))(local_c0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    anon_unknown_4::normalizeArg(&local_100,&local_e0);
    anon_unknown_4::normalizeArg(&local_b0,(string *)argv);
    if (local_100._M_string_length == local_b0._M_string_length) {
      if (local_100._M_string_length == 0) {
        bVar6 = true;
      }
      else {
        iVar3 = bcmp(local_100._M_dataplus._M_p,local_b0._M_dataplus._M_p,local_100._M_string_length
                    );
        bVar6 = iVar3 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != paVar1) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      sVar4 = *(size_t *)this;
      *(undefined8 **)this = (undefined8 *)(sVar4 + 8);
      if (*(long *)(sVar4 + 8) != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,*(char **)(sVar4 + 8),(allocator<char> *)&local_b0);
        out_01.n = sVar4;
        out_01.ptr = out.ptr;
        anon_unknown_4::initArg((anon_unknown_4 *)&local_100,local_b8,out_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != paVar1) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        *(long *)this = *(long *)this + 8;
        bVar6 = true;
        goto LAB_002083d6;
      }
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_70,"missing value after %s argument",&local_e0);
      if (*(long *)(local_c0 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(local_c0 + 0x18))(local_c0,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
    bVar6 = false;
  }
LAB_002083d6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}